

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_tcp_connection.cc
# Opt level: O0

void __thiscall AliTcpConnection::AliTcpConnection(AliTcpConnection *this,string *host,int port)

{
  int port_local;
  string *host_local;
  AliTcpConnection *this_local;
  
  AliConnection::AliConnection(&this->super_AliConnection);
  (this->super_AliConnection)._vptr_AliConnection = (_func_int **)&PTR_Connect_001f0e38;
  this->fd_ = 0;
  std::__cxx11::string::string((string *)&this->host_,(string *)host);
  this->port_ = port;
  return;
}

Assistant:

AliTcpConnection::AliTcpConnection(std::string host, int port) :
                                    fd_(0),
                                    host_(host),
                                    port_(port) {
}